

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall soplex::SPxBasisBase<double>::~SPxBasisBase(SPxBasisBase<double> *this)

{
  this->_vptr_SPxBasisBase = (_func_int **)&PTR_change_0053dd18;
  if (this->freeSlinSolver == true) {
    if (this->factor != (SLinSolver<double> *)0x0) {
      (*this->factor->_vptr_SLinSolver[0x1c])();
    }
    this->factor = (SLinSolver<double> *)0x0;
  }
  (**this->theTime->_vptr_Timer)();
  spx_free<soplex::Timer*>(&this->theTime);
  Desc::~Desc(&this->thedesc);
  DataArray<const_soplex::SVectorBase<double>_*>::~DataArray(&this->matrix);
  DataArray<soplex::SPxId>::~DataArray(&this->theBaseId);
  return;
}

Assistant:

SPxBasisBase<R>::~SPxBasisBase()
{

   assert(!freeSlinSolver || factor != nullptr);

   if(freeSlinSolver)
   {
      delete factor;
      factor = nullptr;
   }

   theTime->~Timer();
   spx_free(theTime);
}